

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O1

bool __thiscall BlockFilterIndex::CustomCommit(BlockFilterIndex *this,CDBBatch *batch)

{
  long lVar1;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  bool bVar2;
  FILE *file_00;
  char *fmt;
  FlatFilePos *pos;
  int source_line;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  void *pvVar3;
  long lVar4;
  AutoFile file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pos = &this->m_next_filter_pos;
  file_00 = FlatFileSeq::Open((this->m_filter_fileseq)._M_t.
                              super___uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_FlatFileSeq_*,_std::default_delete<FlatFileSeq>_>
                              .super__Head_base<0UL,_FlatFileSeq_*,_false>._M_head_impl,pos,false);
  pvVar3 = (void *)0x0;
  lVar4 = 0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  AutoFile::AutoFile(&file,file_00,data_xor);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,lVar4 - (long)pvVar3);
  }
  if (file.m_file == (FILE *)0x0) {
    fmt = "%s: Failed to open filter file %d\n";
    source_line = 0x97;
  }
  else {
    bVar2 = AutoFile::Commit(&file);
    if (bVar2) {
      bVar2 = true;
      CDBBatch::Write<unsigned_char,FlatFilePos>(batch,"P16BlockFilterIndex",pos);
      goto LAB_0047b9f0;
    }
    fmt = "%s: Failed to commit filter file %d\n";
    source_line = 0x9b;
  }
  logging_function._M_str = "CustomCommit";
  logging_function._M_len = 0xc;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/blockfilterindex.cpp"
  ;
  source_file._M_len = 0x6a;
  LogPrintFormatInternal<char[13],int>
            (logging_function,source_file,source_line,ALL,Error,(ConstevalFormatString<2U>)fmt,
             (char (*) [13])"CustomCommit",&pos->nFile);
  bVar2 = false;
LAB_0047b9f0:
  AutoFile::~AutoFile(&file);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::CustomCommit(CDBBatch& batch)
{
    const FlatFilePos& pos = m_next_filter_pos;

    // Flush current filter file to disk.
    AutoFile file{m_filter_fileseq->Open(pos)};
    if (file.IsNull()) {
        LogError("%s: Failed to open filter file %d\n", __func__, pos.nFile);
        return false;
    }
    if (!file.Commit()) {
        LogError("%s: Failed to commit filter file %d\n", __func__, pos.nFile);
        return false;
    }

    batch.Write(DB_FILTER_POS, pos);
    return true;
}